

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_gen.cc
# Opt level: O3

bool google::protobuf::internal::anon_unknown_36::GetEnumValidationRange
               (EnumDescriptor *enum_type,int32_t *first,int32_t *last)

{
  EnumValueDescriptor *pEVar1;
  int iVar2;
  uint uVar3;
  unsigned_long *__s;
  int iVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  int *piVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  unsigned_long auStack_138 [32];
  ulong local_38;
  unsigned_long *local_30;
  
  __s = auStack_138;
  uVar3 = enum_type->value_count_;
  uVar7 = (ulong)uVar3;
  if (uVar3 - 1 == (int)enum_type->sequential_value_limit_) {
    if (0 < (int)uVar3) {
      pEVar1 = enum_type->values_;
      *first = pEVar1->number_;
      if (0 < enum_type->value_count_) {
        *last = pEVar1[enum_type->value_count_ - 1].number_;
        return true;
      }
      goto LAB_0020a3f5;
    }
LAB_0020a3e5:
    _GLOBAL__N_1::GetEnumValidationRange();
  }
  else if (0 < (int)uVar3) {
    iVar2 = enum_type->values_->number_;
    if (uVar3 == 1) {
      uVar7 = 1;
      iVar5 = iVar2;
    }
    else {
      lVar11 = uVar7 - 1;
      piVar9 = &enum_type->values_[1].number_;
      iVar4 = iVar2;
      do {
        iVar5 = *piVar9;
        if (iVar5 < iVar2) {
          iVar2 = iVar5;
        }
        if (iVar5 < iVar4) {
          iVar5 = iVar4;
        }
        piVar9 = piVar9 + 0xc;
        lVar11 = lVar11 + -1;
        iVar4 = iVar5;
      } while (lVar11 != 0);
    }
    lVar11 = (long)iVar5 - (long)iVar2;
    if (lVar11 < (long)uVar7) {
      *first = iVar2;
      lVar6 = lVar11 + 0x7f;
      if (-1 < lVar11 + 0x40) {
        lVar6 = lVar11 + 0x40;
      }
      *last = iVar5;
      local_38 = lVar6 >> 6;
      if (0x20 < local_38) {
        __s = __gnu_cxx::new_allocator<unsigned_long>::allocate
                        ((new_allocator<unsigned_long> *)&local_38,local_38,(void *)0x0);
      }
      local_30 = __s;
      if (local_38 != 0) {
        memset(__s,0,local_38 << 3);
      }
      iVar4 = enum_type->value_count_;
      uVar7 = 0;
      if (0 < (long)iVar4) {
        pEVar1 = enum_type->values_;
        lVar6 = 0;
        do {
          uVar8 = (long)*(int *)((long)&pEVar1->number_ + lVar6) - (long)iVar2;
          uVar10 = uVar8 >> 6;
          if (local_38 <= uVar10) {
            _GLOBAL__N_1::GetEnumValidationRange();
            goto LAB_0020a3e5;
          }
          uVar3 = ((int)uVar7 + 1) - (uint)((__s[uVar10] >> (uVar8 & 0x3f) & 1) != 0);
          uVar7 = (ulong)uVar3;
          __s[uVar10] = __s[uVar10] | 1L << (uVar8 & 0x3f);
          lVar6 = lVar6 + 0x30;
        } while ((long)iVar4 * 0x30 != lVar6);
        uVar7 = (ulong)uVar3;
      }
      bVar12 = lVar11 + 1U == uVar7;
      if (0x20 < local_38) {
        operator_delete(__s,local_38 << 3);
      }
    }
    else {
      bVar12 = false;
    }
    return bVar12;
  }
  _GLOBAL__N_1::GetEnumValidationRange();
LAB_0020a3f5:
  _GLOBAL__N_1::GetEnumValidationRange();
}

Assistant:

bool GetEnumValidationRange(const EnumDescriptor* enum_type, int32_t& first,
                            int32_t& last) {
  if (!IsEnumFullySequential(enum_type)) {
    // Maybe the labels are not sequential in declaration order, but the values
    // could still be a dense range. Try the slower approach.
    return GetEnumValidationRangeSlow(enum_type, first, last);
  }

  first = enum_type->value(0)->number();
  last = enum_type->value(enum_type->value_count() - 1)->number();
  return true;
}